

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>>::
initialize<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>>
          (optional<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>> *this,
          Animatable<tinyusdz::GeomMesh::InterpolateBoundary> *value)

{
  bool bVar1;
  Animatable<tinyusdz::GeomMesh::InterpolateBoundary> *value_local;
  optional<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>_> *this_local;
  
  bVar1 = optional<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>_>::has_value
                    ((optional<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>_> *)
                     this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("! has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                  ,0x5dd,
                  "void nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>>::initialize(V &&) [T = tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>, V = tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>]"
                 );
  }
  detail::storage_t<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>_>::construct_value
            ((storage_t<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>_> *)(this + 8)
             ,value);
  *this = (optional<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>>)0x1;
  return;
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }